

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sha1.cpp
# Opt level: O0

ON_SHA1_Hash * __thiscall ON_SHA1::Hash(ON_SHA1_Hash *__return_storage_ptr__,ON_SHA1 *this)

{
  undefined1 local_90 [8];
  ON_SHA1 tmp;
  ON_SHA1 *this_local;
  
  if ((this->m_status_bits & 2) != 2) {
    tmp.m_sha1_hash.m_digest._12_8_ = this;
    memcpy(local_90,this,0x80);
    if ((this->m_status_bits & 1) != 1) {
      Reset((ON_SHA1 *)local_90);
    }
    set_final_hash((ON_SHA1 *)local_90);
    *(undefined8 *)(this->m_sha1_hash).m_digest = tmp.m_state._12_8_;
    *(undefined8 *)((this->m_sha1_hash).m_digest + 8) = tmp.m_sha1_hash.m_digest._0_8_;
    *(undefined4 *)((this->m_sha1_hash).m_digest + 0x10) = tmp.m_sha1_hash.m_digest._8_4_;
    this->m_status_bits = this->m_status_bits | 2;
  }
  *(undefined8 *)__return_storage_ptr__->m_digest = *(undefined8 *)(this->m_sha1_hash).m_digest;
  *(undefined8 *)(__return_storage_ptr__->m_digest + 8) =
       *(undefined8 *)((this->m_sha1_hash).m_digest + 8);
  *(undefined4 *)(__return_storage_ptr__->m_digest + 0x10) =
       *(undefined4 *)((this->m_sha1_hash).m_digest + 0x10);
  return __return_storage_ptr__;
}

Assistant:

ON_SHA1_Hash ON_SHA1::Hash() const
{
  if (2 != (2 & m_status_bits))
  {
    ON_SHA1 tmp(*this);
    if (1 != (1 & m_status_bits))
      tmp.Reset();
    tmp.set_final_hash();
    m_sha1_hash = tmp.m_sha1_hash;
    m_status_bits |= 2;
  }
  return m_sha1_hash;
}